

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O0

int u8_nativetoutf8(char *dest,int sz,char *src,int srcsz)

{
  size_t sVar1;
  int local_2c;
  int local_24;
  int len;
  int srcsz_local;
  char *src_local;
  int sz_local;
  char *dest_local;
  
  local_24 = srcsz;
  if (srcsz < 0) {
    sVar1 = strlen(src);
    local_24 = (int)sVar1 + 1;
  }
  local_2c = sz;
  if (local_24 < sz) {
    local_2c = local_24;
  }
  strncpy(dest,src,(long)local_2c);
  return local_2c;
}

Assistant:

int u8_nativetoutf8(char *dest, int sz, const char *src, int srcsz)
{
    int len;
#ifdef _WIN32
    int res;
    wchar_t*wbuf = 0;
    if(srcsz < 0) {
        len = MultiByteToWideChar(CP_OEMCP, 0, src, srcsz, wbuf, 0);
    } else {
        len = (srcsz < sz)?srcsz:sz;
    }
    wbuf = getbytes(len * sizeof(*wbuf));
    res = MultiByteToWideChar(CP_OEMCP, 0, src, srcsz, wbuf, len);
    if(res) {
        res = WideCharToMultiByte(CP_UTF8, 0, wbuf, len, dest, sz, 0, 0);
    }
    freebytes(wbuf, len * sizeof(*wbuf));
    return (res)?len:0;
#endif
        /* on other systems, we use UTF-8 for everything, so this is a no-op */
    if(srcsz < 0)
        srcsz = strlen(src) + 1;
    len = (srcsz < sz)?srcsz:sz;
    strncpy(dest, src, len);
    return len;
}